

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

PaError OpenStream(PaUtilHostApiRepresentation *hostApi,PaStream **s,
                  PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate,unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                  PaStreamCallback *callback,void *userData)

{
  int iVar1;
  char *pcVar2;
  unsigned_long uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  PaUtilHostBufferSizeMode local_bc;
  double dStack_b8;
  PaUtilHostBufferSizeMode hostBufferSizeMode;
  PaTime outputLatency;
  PaTime inputLatency;
  int numOutputChannels;
  int numInputChannels;
  PaSampleFormat outputSampleFormat;
  PaSampleFormat inputSampleFormat;
  PaSampleFormat hostOutputSampleFormat;
  PaSampleFormat hostInputSampleFormat;
  PaAlsaStream *stream;
  PaAlsaHostApiRepresentation *alsaHostApi;
  PaStreamFlags PStack_68;
  PaError result;
  PaStreamFlags streamFlags_local;
  unsigned_long framesPerBuffer_local;
  double sampleRate_local;
  PaStreamParameters *outputParameters_local;
  PaStreamParameters *inputParameters_local;
  PaStream **s_local;
  PaUtilHostApiRepresentation *hostApi_local;
  
  alsaHostApi._4_4_ = 0;
  hostInputSampleFormat = 0;
  hostOutputSampleFormat = 0;
  inputSampleFormat = 0;
  outputSampleFormat = 0;
  _numOutputChannels = 0;
  inputLatency._4_4_ = 0;
  inputLatency._0_4_ = 0;
  local_bc = paUtilFixedHostBufferSize;
  if ((streamFlags & 0xffff0000) != 0) {
    return -0x270b;
  }
  stream = (PaAlsaStream *)hostApi;
  PStack_68 = streamFlags;
  streamFlags_local = framesPerBuffer;
  framesPerBuffer_local = (unsigned_long)sampleRate;
  sampleRate_local = (double)outputParameters;
  outputParameters_local = inputParameters;
  inputParameters_local = (PaStreamParameters *)s;
  s_local = (PaStream **)hostApi;
  if (inputParameters != (PaStreamParameters *)0x0) {
    paUtilErr_ = ValidateParameters(inputParameters,hostApi,StreamDirection_In);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'ValidateParameters( inputParameters, hostApi, StreamDirection_In )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2813\n"
                       );
      alsaHostApi._4_4_ = paUtilErr_;
      goto LAB_00113358;
    }
    inputLatency._4_4_ = outputParameters_local->channelCount;
    outputSampleFormat = outputParameters_local->sampleFormat;
  }
  if (sampleRate_local != 0.0) {
    paUtilErr_ = ValidateParameters((PaStreamParameters *)sampleRate_local,
                                    (PaUtilHostApiRepresentation *)s_local,StreamDirection_Out);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'ValidateParameters( outputParameters, hostApi, StreamDirection_Out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2820\n"
                       );
      alsaHostApi._4_4_ = paUtilErr_;
      goto LAB_00113358;
    }
    inputLatency._0_4_ = *(int *)((long)sampleRate_local + 4);
    _numOutputChannels = *(PaSampleFormat *)((long)sampleRate_local + 8);
  }
  if ((streamFlags_local == 0) && (pcVar2 = getenv("PA_ALSA_PERIODSIZE"), pcVar2 != (char *)0x0)) {
    pcVar2 = getenv("PA_ALSA_PERIODSIZE");
    iVar1 = atoi(pcVar2);
    streamFlags_local = (PaStreamFlags)iVar1;
  }
  hostInputSampleFormat = (PaSampleFormat)PaUtil_AllocateMemory(0x388);
  if ((PaAlsaStream *)hostInputSampleFormat == (PaAlsaStream *)0x0) {
    PaUtil_DebugPrint(
                     "Expression \'stream = (PaAlsaStream*)PaUtil_AllocateMemory( sizeof(PaAlsaStream) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2833\n"
                     );
    alsaHostApi._4_4_ = -0x2708;
  }
  else {
    paUtilErr_ = PaAlsaStream_Initialize
                           ((PaAlsaStream *)hostInputSampleFormat,
                            (PaAlsaHostApiRepresentation *)stream,outputParameters_local,
                            (PaStreamParameters *)sampleRate_local,(double)framesPerBuffer_local,
                            streamFlags_local,callback,PStack_68,userData);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_Initialize( stream, alsaHostApi, inputParameters, outputParameters, sampleRate, framesPerBuffer, callback, streamFlags, userData )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2835\n"
                       );
      alsaHostApi._4_4_ = paUtilErr_;
    }
    else {
      paUtilErr_ = PaAlsaStream_Configure
                             ((PaAlsaStream *)hostInputSampleFormat,outputParameters_local,
                              (PaStreamParameters *)sampleRate_local,(double)framesPerBuffer_local,
                              streamFlags_local,&outputLatency,&stack0xffffffffffffff48,&local_bc);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStream_Configure( stream, inputParameters, outputParameters, sampleRate, framesPerBuffer, &inputLatency, &outputLatency, &hostBufferSizeMode )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2838\n"
                         );
        alsaHostApi._4_4_ = paUtilErr_;
      }
      else {
        uVar4 = 0;
        if (*(int *)(hostInputSampleFormat + 0x29c) == 0) {
          uVar4 = 0x80000000;
        }
        hostOutputSampleFormat = *(ulong *)(hostInputSampleFormat + 0x288) | uVar4;
        uVar4 = 0;
        if (*(int *)(hostInputSampleFormat + 0x31c) == 0) {
          uVar4 = 0x80000000;
        }
        inputSampleFormat = *(ulong *)(hostInputSampleFormat + 0x308) | uVar4;
        paUtilErr_ = PaUtil_InitializeBufferProcessor
                               ((PaUtilBufferProcessor *)(hostInputSampleFormat + 0x68),
                                inputLatency._4_4_,outputSampleFormat,hostOutputSampleFormat,
                                inputLatency._0_4_,_numOutputChannels,inputSampleFormat,
                                (double)framesPerBuffer_local,PStack_68,streamFlags_local,
                                *(unsigned_long *)(hostInputSampleFormat + 0x218),local_bc,callback,
                                userData);
        if (-1 < paUtilErr_) {
          if (0 < inputLatency._4_4_) {
            uVar3 = PaUtil_GetBufferProcessorInputLatencyFrames
                              ((PaUtilBufferProcessor *)(hostInputSampleFormat + 0x68));
            auVar5._8_4_ = (int)(uVar3 >> 0x20);
            auVar5._0_8_ = uVar3;
            auVar5._12_4_ = 0x45300000;
            *(double *)(hostInputSampleFormat + 0x38) =
                 outputLatency +
                 ((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                 (double)framesPerBuffer_local;
          }
          if (0 < inputLatency._0_4_) {
            uVar3 = PaUtil_GetBufferProcessorOutputLatencyFrames
                              ((PaUtilBufferProcessor *)(hostInputSampleFormat + 0x68));
            auVar6._8_4_ = (int)(uVar3 >> 0x20);
            auVar6._0_8_ = uVar3;
            auVar6._12_4_ = 0x45300000;
            *(double *)(hostInputSampleFormat + 0x40) =
                 dStack_b8 +
                 ((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                 (double)framesPerBuffer_local;
          }
          inputParameters_local->device = (undefined4)hostInputSampleFormat;
          inputParameters_local->channelCount = hostInputSampleFormat._4_4_;
          return alsaHostApi._4_4_;
        }
        PaUtil_DebugPrint(
                         "Expression \'PaUtil_InitializeBufferProcessor( &stream->bufferProcessor, numInputChannels, inputSampleFormat, hostInputSampleFormat, numOutputChannels, outputSampleFormat, hostOutputSampleFormat, sampleRate, streamFlags, framesPerBuffer, stream->maxFramesPerHostBuffer, hostBufferSizeMode, callback, userData )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2846\n"
                         );
        alsaHostApi._4_4_ = paUtilErr_;
      }
    }
  }
LAB_00113358:
  if (hostInputSampleFormat != 0) {
    PaAlsaStream_Terminate((PaAlsaStream *)hostInputSampleFormat);
  }
  return alsaHostApi._4_4_;
}

Assistant:

static PaError OpenStream( struct PaUtilHostApiRepresentation *hostApi,
                           PaStream** s,
                           const PaStreamParameters *inputParameters,
                           const PaStreamParameters *outputParameters,
                           double sampleRate,
                           unsigned long framesPerBuffer,
                           PaStreamFlags streamFlags,
                           PaStreamCallback *streamCallback,
                           void *userData )
{
    PaError result = paNoError;
    PaSkeletonHostApiRepresentation *skeletonHostApi = (PaSkeletonHostApiRepresentation*)hostApi;
    PaSkeletonStream *stream = 0;
    unsigned long framesPerHostBuffer = framesPerBuffer; /* these may not be equivalent for all implementations */
    int inputChannelCount, outputChannelCount;
    PaSampleFormat inputSampleFormat, outputSampleFormat;
    PaSampleFormat hostInputSampleFormat, hostOutputSampleFormat;


    if( inputParameters )
    {
        inputChannelCount = inputParameters->channelCount;
        inputSampleFormat = inputParameters->sampleFormat;

        /* unless alternate device specification is supported, reject the use of
            paUseHostApiSpecificDeviceSpecification */

        if( inputParameters->device == paUseHostApiSpecificDeviceSpecification )
            return paInvalidDevice;

        /* check that input device can support inputChannelCount */
        if( inputChannelCount > hostApi->deviceInfos[ inputParameters->device ]->maxInputChannels )
            return paInvalidChannelCount;

        /* validate inputStreamInfo */
        if( inputParameters->hostApiSpecificStreamInfo )
            return paIncompatibleHostApiSpecificStreamInfo; /* this implementation doesn't use custom stream info */

        /* IMPLEMENT ME - establish which  host formats are available */
        hostInputSampleFormat =
            PaUtil_SelectClosestAvailableFormat( paInt16 /* native formats */, inputSampleFormat );
    }
    else
    {
        inputChannelCount = 0;
        inputSampleFormat = hostInputSampleFormat = paInt16; /* Surpress 'uninitialised var' warnings. */
    }

    if( outputParameters )
    {
        outputChannelCount = outputParameters->channelCount;
        outputSampleFormat = outputParameters->sampleFormat;
        
        /* unless alternate device specification is supported, reject the use of
            paUseHostApiSpecificDeviceSpecification */

        if( outputParameters->device == paUseHostApiSpecificDeviceSpecification )
            return paInvalidDevice;

        /* check that output device can support inputChannelCount */
        if( outputChannelCount > hostApi->deviceInfos[ outputParameters->device ]->maxOutputChannels )
            return paInvalidChannelCount;

        /* validate outputStreamInfo */
        if( outputParameters->hostApiSpecificStreamInfo )
            return paIncompatibleHostApiSpecificStreamInfo; /* this implementation doesn't use custom stream info */

        /* IMPLEMENT ME - establish which  host formats are available */
        hostOutputSampleFormat =
            PaUtil_SelectClosestAvailableFormat( paInt16 /* native formats */, outputSampleFormat );
    }
    else
    {
        outputChannelCount = 0;
        outputSampleFormat = hostOutputSampleFormat = paInt16; /* Surpress 'uninitialized var' warnings. */
    }

    /*
        IMPLEMENT ME:

        ( the following two checks are taken care of by PaUtil_InitializeBufferProcessor() FIXME - checks needed? )

            - check that input device can support inputSampleFormat, or that
                we have the capability to convert from outputSampleFormat to
                a native format

            - check that output device can support outputSampleFormat, or that
                we have the capability to convert from outputSampleFormat to
                a native format

            - if a full duplex stream is requested, check that the combination
                of input and output parameters is supported

            - check that the device supports sampleRate

            - alter sampleRate to a close allowable rate if possible / necessary

            - validate suggestedInputLatency and suggestedOutputLatency parameters,
                use default values where necessary
    */




    /* validate platform specific flags */
    if( (streamFlags & paPlatformSpecificFlags) != 0 )
        return paInvalidFlag; /* unexpected platform specific flag */


    stream = (PaSkeletonStream*)PaUtil_AllocateMemory( sizeof(PaSkeletonStream) );
    if( !stream )
    {
        result = paInsufficientMemory;
        goto error;
    }

    if( streamCallback )
    {
        PaUtil_InitializeStreamRepresentation( &stream->streamRepresentation,
                                               &skeletonHostApi->callbackStreamInterface, streamCallback, userData );
    }
    else
    {
        PaUtil_InitializeStreamRepresentation( &stream->streamRepresentation,
                                               &skeletonHostApi->blockingStreamInterface, streamCallback, userData );
    }

    PaUtil_InitializeCpuLoadMeasurer( &stream->cpuLoadMeasurer, sampleRate );


    /* we assume a fixed host buffer size in this example, but the buffer processor
        can also support bounded and unknown host buffer sizes by passing 
        paUtilBoundedHostBufferSize or paUtilUnknownHostBufferSize instead of
        paUtilFixedHostBufferSize below. */
        
    result =  PaUtil_InitializeBufferProcessor( &stream->bufferProcessor,
              inputChannelCount, inputSampleFormat, hostInputSampleFormat,
              outputChannelCount, outputSampleFormat, hostOutputSampleFormat,
              sampleRate, streamFlags, framesPerBuffer,
              framesPerHostBuffer, paUtilFixedHostBufferSize,
              streamCallback, userData );
    if( result != paNoError )
        goto error;


    /*
        IMPLEMENT ME: initialise the following fields with estimated or actual
        values.
    */
    stream->streamRepresentation.streamInfo.inputLatency =
            (PaTime)PaUtil_GetBufferProcessorInputLatencyFrames(&stream->bufferProcessor) / sampleRate; /* inputLatency is specified in _seconds_ */
    stream->streamRepresentation.streamInfo.outputLatency =
            (PaTime)PaUtil_GetBufferProcessorOutputLatencyFrames(&stream->bufferProcessor) / sampleRate; /* outputLatency is specified in _seconds_ */
    stream->streamRepresentation.streamInfo.sampleRate = sampleRate;

    
    /*
        IMPLEMENT ME:
            - additional stream setup + opening
    */

    stream->framesPerHostCallback = framesPerHostBuffer;

    *s = (PaStream*)stream;

    return result;

error:
    if( stream )
        PaUtil_FreeMemory( stream );

    return result;
}